

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O0

void __thiscall ObjectFile::store(ObjectFile *this,bool isCommit)

{
  bool bVar1;
  undefined8 uVar2;
  byte in_SIL;
  long in_RDI;
  File lockFile;
  MutexLocker lock;
  File objectFile;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffefc;
  File *in_stack_ffffffffffffff00;
  string local_e0 [7];
  undefined1 in_stack_ffffffffffffff27;
  File *in_stack_ffffffffffffff28;
  File *in_stack_ffffffffffffff70;
  ObjectFile *in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff81;
  undefined1 in_stack_ffffffffffffff82;
  undefined1 in_stack_ffffffffffffff83;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  uint uVar4;
  undefined4 in_stack_ffffffffffffff8c;
  File *in_stack_ffffffffffffff90;
  string local_68 [32];
  File local_48;
  byte local_9;
  
  local_9 = in_SIL & 1;
  if ((local_9 == 0) && ((*(byte *)(in_RDI + 0x80) & 1) != 0)) {
    return;
  }
  if ((*(byte *)(in_RDI + 0x68) & 1) == 0) {
    uVar2 = std::__cxx11::string::c_str();
    softHSMLog(7,"store",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0x2a0,"Cannot write back an invalid object %s",uVar2);
    return;
  }
  std::__cxx11::string::string(local_68,(string *)(in_RDI + 8));
  uVar3 = 0;
  File::File(in_stack_ffffffffffffff90,
             (string *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             in_stack_ffffffffffffff84,(bool)in_stack_ffffffffffffff83,
             (bool)in_stack_ffffffffffffff82,(bool)in_stack_ffffffffffffff81,
             (bool)in_stack_ffffffffffffff80);
  std::__cxx11::string::~string(local_68);
  bVar1 = File::isValid(&local_48);
  if (bVar1) {
    File::lock(in_stack_ffffffffffffff28,(bool)in_stack_ffffffffffffff27);
    if ((local_9 & 1) == 0) {
      MutexLocker::MutexLocker
                ((MutexLocker *)in_stack_ffffffffffffff00,
                 (Mutex *)CONCAT44(in_stack_fffffffffffffefc,uVar3));
      std::__cxx11::string::string(local_e0,(string *)(in_RDI + 0x90));
      File::File(in_stack_ffffffffffffff90,
                 (string *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                 in_stack_ffffffffffffff84,(bool)in_stack_ffffffffffffff83,
                 (bool)in_stack_ffffffffffffff82,(bool)in_stack_ffffffffffffff81,
                 (bool)in_stack_ffffffffffffff80);
      std::__cxx11::string::~string(local_e0);
      bVar1 = writeAttributes(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      if (!bVar1) {
        *(undefined1 *)(in_RDI + 0x68) = 0;
      }
      uVar4 = (uint)!bVar1;
      File::~File(in_stack_ffffffffffffff00);
      MutexLocker::~MutexLocker((MutexLocker *)in_stack_ffffffffffffff00);
      if (uVar4 != 0) goto LAB_001d550c;
    }
    else {
      bVar1 = writeAttributes(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      if (!bVar1) {
        *(undefined1 *)(in_RDI + 0x68) = 0;
        goto LAB_001d550c;
      }
    }
    *(undefined1 *)(in_RDI + 0x68) = 1;
  }
  else {
    uVar2 = std::__cxx11::string::c_str();
    softHSMLog(7,"store",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0x2a9,"Cannot open object %s for writing",uVar2);
    *(undefined1 *)(in_RDI + 0x68) = 0;
  }
LAB_001d550c:
  File::~File(in_stack_ffffffffffffff00);
  return;
}

Assistant:

void ObjectFile::store(bool isCommit /* = false */)
{
	// Check if we're in the middle of a transaction
	if (!isCommit && inTransaction)
	{
		return;
	}

	if (!valid)
	{
		DEBUG_MSG("Cannot write back an invalid object %s", path.c_str());

		return;
	}

	File objectFile(path, umask, true, true, true, false);

	if (!objectFile.isValid())
	{
		DEBUG_MSG("Cannot open object %s for writing", path.c_str());

		valid = false;

		return;
	}

	objectFile.lock();

	if (!isCommit) {
		MutexLocker lock(objectMutex);
		File lockFile(lockpath, umask, false, true, true);

		if (!writeAttributes(objectFile))
		{
			valid = false;

			return;
		}
	}
	else
	{
		if (!writeAttributes(objectFile))
		{
			valid = false;

			return;
		}
	}

	valid = true;
}